

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_RepeatedWritesToSameKey_Test::TestBody(DBTest_RepeatedWritesToSameKey_Test *this)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *message;
  int in_ECX;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  string local_c8;
  undefined1 local_a8 [20];
  int i;
  string value;
  Random rnd;
  int kMaxFiles;
  Options options;
  DBTest_RepeatedWritesToSameKey_Test *this_local;
  
  DBTest::CurrentOptions((Options *)&rnd,&this->super_DBTest);
  DBTest::Reopen(&this->super_DBTest,(Options *)&rnd);
  value.field_2._12_4_ = 0x13;
  Random::Random((Random *)((long)&value.field_2 + 8),0x12d);
  RandomString_abi_cxx11_
            ((string *)(local_a8 + 0x10),(leveldb *)(value.field_2._M_local_buf + 8),
             (Random *)0x30d40,in_ECX);
  for (local_a8._12_4_ = 0; (int)local_a8._12_4_ < 0x5f; local_a8._12_4_ = local_a8._12_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c8,"key",
               (allocator *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    DBTest::Put((DBTest *)local_a8,(string *)this,&local_c8);
    Status::~Status((Status *)local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_e4 = DBTest::TotalTableFiles(&this->super_DBTest);
    testing::internal::CmpHelperLE<int,int>
              ((internal *)local_e0,"TotalTableFiles()","kMaxFiles",&local_e4,
               (int *)(value.field_2._M_local_buf + 0xc));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x460,message);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    __stream = _stderr;
    if (!bVar1) break;
    uVar2 = local_a8._12_4_ + 1;
    uVar3 = DBTest::TotalTableFiles(&this->super_DBTest);
    fprintf(__stream,"after %d: %d files\n",(ulong)uVar2,(ulong)uVar3);
  }
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  return;
}

Assistant:

TEST_F(DBTest, RepeatedWritesToSameKey) {
  Options options = CurrentOptions();
  options.env = env_;
  options.write_buffer_size = 100000;  // Small write buffer
  Reopen(&options);

  // We must have at most one file per level except for level-0,
  // which may have up to kL0_StopWritesTrigger files.
  const int kMaxFiles = config::kNumLevels + config::kL0_StopWritesTrigger;

  Random rnd(301);
  std::string value = RandomString(&rnd, 2 * options.write_buffer_size);
  for (int i = 0; i < 5 * kMaxFiles; i++) {
    Put("key", value);
    ASSERT_LE(TotalTableFiles(), kMaxFiles);
    std::fprintf(stderr, "after %d: %d files\n", i + 1, TotalTableFiles());
  }
}